

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O2

DSA * DSA_parse_public_key(CBS *cbs)

{
  int iVar1;
  _Head_base<0UL,_dsa_st_*,_false> dsa;
  pointer __p;
  CBS child;
  UniquePtr<DSA> ret;
  
  dsa._M_head_impl = (dsa_st *)DSA_new();
  ret._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_dsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)dsa._M_head_impl;
  if ((tuple<dsa_st_*,_bssl::internal::Deleter>)dsa._M_head_impl ==
      (_Head_base<0UL,_dsa_st_*,_false>)0x0) {
LAB_002cff4a:
    dsa._M_head_impl = (dsa_st *)0x0;
  }
  else {
    iVar1 = CBS_get_asn1(cbs,&child,0x20000010);
    if (iVar1 != 0) {
      iVar1 = parse_integer(&child,&(dsa._M_head_impl)->pub_key);
      if (iVar1 != 0) {
        iVar1 = parse_integer(&child,(BIGNUM **)dsa._M_head_impl);
        if (iVar1 != 0) {
          iVar1 = parse_integer(&child,&(dsa._M_head_impl)->q);
          if (iVar1 != 0) {
            iVar1 = parse_integer(&child,&(dsa._M_head_impl)->g);
            if ((iVar1 != 0) && (child.len == 0)) {
              iVar1 = dsa_check_key(dsa._M_head_impl);
              if (iVar1 != 0) {
                ret._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)
                     (__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>)0x0;
                goto LAB_002cff4c;
              }
              goto LAB_002cff4a;
            }
          }
        }
      }
    }
    dsa._M_head_impl = (dsa_st *)0x0;
    ERR_put_error(10,0,0x69,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_asn1.cc"
                  ,0x96);
  }
LAB_002cff4c:
  std::unique_ptr<dsa_st,_bssl::internal::Deleter>::~unique_ptr(&ret);
  return dsa._M_head_impl;
}

Assistant:

DSA *DSA_parse_public_key(CBS *cbs) {
  bssl::UniquePtr<DSA> ret(DSA_new());
  if (ret == nullptr) {
    return nullptr;
  }
  CBS child;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !parse_integer(&child, &ret->pub_key) ||
      !parse_integer(&child, &ret->p) ||
      !parse_integer(&child, &ret->q) ||
      !parse_integer(&child, &ret->g) ||
      CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_DECODE_ERROR);
    return nullptr;
  }
  if (!dsa_check_key(ret.get())) {
    return nullptr;
  }
  return ret.release();
}